

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O3

void __thiscall
dlib::list_box_helper::
list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
::draw(list_box<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
       *this,canvas *c)

{
  list_box_style *plVar1;
  rectangle *prVar2;
  long lVar3;
  data<std::__cxx11::basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_>
  *pdVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  rectangle r;
  
  scrollable_region::draw(&this->super_scrollable_region,c);
  prVar2 = scrollable_region::display_rect(&this->super_scrollable_region);
  lVar5 = (c->super_rectangle).l;
  if (lVar5 < prVar2->l) {
    lVar5 = prVar2->l;
  }
  lVar9 = (c->super_rectangle).t;
  if (lVar9 < prVar2->t) {
    lVar9 = prVar2->t;
  }
  lVar10 = (c->super_rectangle).r;
  lVar7 = prVar2->r;
  if (lVar10 < prVar2->r) {
    lVar7 = lVar10;
  }
  lVar10 = (c->super_rectangle).b;
  lVar3 = prVar2->b;
  if (lVar10 < prVar2->b) {
    lVar3 = lVar10;
  }
  if ((lVar9 <= lVar3) && (lVar5 <= lVar7)) {
    plVar1 = (this->style)._M_t.
             super___uniq_ptr_impl<dlib::list_box_style,_std::default_delete<dlib::list_box_style>_>
             ._M_t.
             super__Tuple_impl<0UL,_dlib::list_box_style_*,_std::default_delete<dlib::list_box_style>_>
             .super__Head_base<0UL,_dlib::list_box_style_*,_false>._M_head_impl;
    prVar2 = scrollable_region::display_rect(&this->super_scrollable_region);
    (*plVar1->_vptr_list_box_style[2])
              (plVar1,c,prVar2,(ulong)(this->super_scrollable_region).super_drawable.enabled);
    prVar2 = scrollable_region::total_rect(&this->super_scrollable_region);
    uVar6 = (this->items).array_size;
    if (uVar6 != 0) {
      pdVar4 = (this->items).array_elements;
      lVar10 = 0;
      uVar8 = 0;
      lVar5 = prVar2->t;
      do {
        lVar7 = *(long *)((long)&pdVar4->height + lVar10) + lVar5;
        if (lVar9 < lVar7) {
          prVar2 = scrollable_region::total_rect(&this->super_scrollable_region);
          lVar7 = prVar2->l;
          prVar2 = scrollable_region::display_rect(&this->super_scrollable_region);
          r.r = prVar2->r;
          r.b = *(long *)((long)&((this->items).array_elements)->height + lVar10) + lVar5 + -1;
          plVar1 = (this->style)._M_t.
                   super___uniq_ptr_impl<dlib::list_box_style,_std::default_delete<dlib::list_box_style>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_dlib::list_box_style_*,_std::default_delete<dlib::list_box_style>_>
                   .super__Head_base<0UL,_dlib::list_box_style_*,_false>._M_head_impl;
          r.l = lVar7;
          r.t = lVar5;
          prVar2 = scrollable_region::display_rect(&this->super_scrollable_region);
          pdVar4 = (this->items).array_elements;
          (*plVar1->_vptr_list_box_style[5])
                    (plVar1,c,&r,prVar2,
                     (ulong)(this->super_scrollable_region).super_drawable.enabled,
                     (this->super_scrollable_region).super_drawable.mfont.
                     super___shared_ptr<dlib::font,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (long)&(pdVar4->name)._M_dataplus._M_p + lVar10,
                     (ulong)(&pdVar4->is_selected)[lVar10]);
          pdVar4 = (this->items).array_elements;
          lVar7 = lVar5 + *(long *)((long)&pdVar4->height + lVar10);
          if (lVar3 < lVar7) {
            return;
          }
          uVar6 = (this->items).array_size;
        }
        uVar8 = uVar8 + 1;
        lVar10 = lVar10 + 0x38;
        lVar5 = lVar7;
      } while (uVar8 < uVar6);
    }
  }
  return;
}

Assistant:

void list_box<S>::
    draw (
        const canvas& c
    ) const
    {
        scrollable_region::draw(c);

        rectangle area = display_rect().intersect(c);
        if (area.is_empty())
            return;

        style->draw_list_box_background(c, display_rect(), enabled);

        long y = total_rect().top();
        for (unsigned long i = 0; i < items.size(); ++i)
        {
            if (y+(long)items[i].height <= area.top())
            {
                y += items[i].height;
                continue;
            }

            rectangle r(total_rect().left(), y, display_rect().right(), y+items[i].height-1);

            style->draw_list_box_item(c,r, display_rect(), enabled, *mfont, items[i].name, items[i].is_selected);


            y += items[i].height;

            if (y > area.bottom())
                break;
        }
    }